

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_fEf.cpp
# Opt level: O2

vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_> *
DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf
          (vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>
           *__return_storage_ptr__,MatrixXd *p1,MatrixXd *p2,Matrix3d *R1,Matrix3d *R2)

{
  double dVar1;
  double dVar2;
  uint __line;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,_27,_1,_0,_27,_1>_> *pCVar4;
  Scalar *pSVar5;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar6;
  long lVar7;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *pCVar8;
  Matrix3d *pMVar9;
  char *__assertion;
  long index;
  byte bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Scalar local_588;
  double local_580;
  Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::DiagonalMatrix<double,_3,_3>,_1>
  local_578;
  DiagonalMatrix<double,_3,_3> S;
  Scalar local_518;
  double local_510;
  double local_508;
  double scale;
  DiagonalMatrix<double,_3,_3> Kinv;
  Vector3d s;
  RelPose relpose;
  Matrix3d R;
  Vector3d kinv;
  Matrix<double,_5,_1,_0,_5,_1> coeffs;
  Matrix3d skew_t;
  Matrix3d x2;
  Vector4cd w;
  Matrix3d Q;
  Matrix3d M;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> qr;
  Matrix3d x1;
  Matrix<double,_27,_1,_0,_27,_1> x;
  
  bVar10 = 0;
  if ((p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows == 2)
  {
    if ((p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows == 2
       ) {
      if ((p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
          3) {
        if ((p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
            == 3) {
          dVar1 = normalize2dpts(p1);
          dVar2 = normalize2dpts(p2);
          uVar11 = SUB84(dVar2,0);
          uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
          if (dVar2 <= dVar1) {
            uVar11 = SUB84(dVar1,0);
            uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
          }
          scale = (double)CONCAT44(uVar12,uVar11);
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = (double)&s;
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[2] = 4.94065645841247e-324;
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[3] = 4.94065645841247e-324;
          s.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
               (double)CONCAT44(uVar12,uVar11);
          pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&qr,&scale)
          ;
          x.super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>.m_storage.m_data.array[0]
               = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                    (pCVar3,(Scalar *)&x);
          Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
                    ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&qr);
          S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[2] = s.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2];
          S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[0] = s.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[0];
          S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[1] = s.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[1];
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = (double)p1;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Homogeneous<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0>>
                    (&x1,(Homogeneous<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)&qr);
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = (double)p2;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Homogeneous<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0>>
                    (&x2,(Homogeneous<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)&qr);
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[2] = S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[1] = S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[3] = (double)&x1;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>>
                    (&x1,(Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>
                          *)&qr);
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[2] = S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[1] = S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[3] = (double)&x2;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>>
                    (&x2,(Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>
                          *)&qr);
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = (double)R2;
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[1] = (double)R1;
          Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
          _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&R,
                     (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
                      *)&qr);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&qr,&x1,0);
          Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::
          CommaInitializer<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
                    ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)&Kinv,&x,
                     (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     &qr);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&relpose,&x1,1);
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)&Kinv,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                               *)&relpose);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&M,&x1,2);
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar4,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                               *)&M);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&Q,&x2,0);
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar4,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                               *)&Q);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&skew_t,&x2,1);
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar4,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                               *)&skew_t);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&w,&x2,2);
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar4,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                               *)&w);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&local_578,&R,0);
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar4,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                               *)&local_578);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&coeffs,&R,1);
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar4,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                               *)&coeffs);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&kinv,&R,2);
          Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                    ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar4,
                     (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     &kinv);
          Eigen::CommaInitializer<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>::finished
                    ((CommaInitializer<Eigen::Matrix<double,_27,_1,_0,_27,_1>_> *)&Kinv);
          calculate_coefficients(&coeffs,&x);
          solve_quartic(&w,coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                           m_storage.m_data.array[1] /
                           coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                           m_storage.m_data.array[0],
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[2] /
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[0],
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[3] /
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[0],
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[4] /
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[0]);
          (__return_storage_ptr__->
          super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>)._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>)._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (index = 0; index != 4; index = index + 1) {
            pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>::
                     operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>
                                 *)&w,index);
            if (ABS(*(double *)(pSVar5->_M_value + 8)) < 1e-12) {
              pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>
                       ::operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>
                                     *)&w,index);
              create_M((Matrix3d *)&qr,*(double *)pSVar5->_M_value,&x);
              local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = (double)&M;
              pCVar8 = &qr;
              pMVar9 = (Matrix3d *)
                       local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0];
              for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[0] =
                     (pCVar8->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[0];
                pCVar8 = (ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                         ((long)pCVar8 + (ulong)bVar10 * -0x10 + 8);
                pMVar9 = (Matrix3d *)((long)pMVar9 + ((ulong)bVar10 * -2 + 1) * 8);
              }
              Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::
              colPivHouseholderQr(&qr,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                       *)&local_578);
              Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::householderQ
                        ((HouseholderSequenceType *)&local_578,&qr);
              Eigen::
              HouseholderSequence<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,1,0,3,1>,1>
              ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>
                        ((HouseholderSequence<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,1,0,3,1>,1>
                          *)&local_578,&Q);
              Eigen::internal::
              BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
              BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>
                               *)&local_578,&Q,2);
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
                        (&relpose.t,
                         (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_578);
              pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>
                       ::operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>
                                     *)&w,index);
              relpose.f = *(double *)pSVar5->_M_value / scale;
              local_580 = 1.0 / relpose.f;
              local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
                   = 0.0;
              local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
                   = 4.94065645841247e-324;
              local_578.m_lhs.m_lhs.m_rhs = (RhsNested)0x1;
              local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = (double)&kinv;
              kinv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] = local_580;
              pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                                 ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                  &local_578,&local_580);
              local_588 = 1.0;
              Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        (pCVar3,&local_588);
              Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
                        ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_578);
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                        (&Kinv.m_diagonal,(Matrix<double,_3,_1,_0,_3,_1> *)&kinv);
              local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
                   = 0.0;
              local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
                   = 4.94065645841247e-324;
              skew_t.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array[0] = 0.0;
              local_578.m_lhs.m_lhs.m_rhs = (RhsNested)0x1;
              local_580 = -relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2];
              local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = (double)&skew_t;
              pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                  &local_578,&local_580);
              pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar6,relpose.t.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data.array + 1);
              pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar6,relpose.t.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data.array + 2);
              local_588 = 0.0;
              pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar6,&local_588);
              local_508 = -relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0];
              pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar6,&local_508);
              local_510 = -relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[1];
              pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar6,&local_510);
              pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar6,(Scalar *)&relpose.t);
              local_518 = 0.0;
              Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar6,&local_518);
              Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished
                        ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_578);
              local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
              local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
              local_578.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
              local_578.m_lhs.m_rhs = &R;
              local_578.m_rhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
              local_578.m_rhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
              local_578.m_rhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
              local_578.m_lhs.m_lhs.m_rhs = &skew_t;
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::DiagonalMatrix<double,3,3>,1>>
                        (&relpose.F,&local_578);
              std::vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>::push_back
                        (__return_storage_ptr__,&relpose);
            }
          }
          return __return_storage_ptr__;
        }
        __assertion = "p2.cols() == nbr_pts";
        __line = 0x30;
      }
      else {
        __assertion = "p1.cols() == nbr_pts";
        __line = 0x2f;
      }
    }
    else {
      __assertion = "p2.rows() == 2";
      __line = 0x2e;
    }
  }
  else {
    __assertion = "p1.rows() == 2";
    __line = 0x2d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/fEf/get_fEf.cpp"
                ,__line,
                "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &)"
               );
}

Assistant:

std::vector<RelPose> get_fEf(
        const Eigen::MatrixXd &p1,
        const Eigen::MatrixXd &p2,
        const Eigen::Matrix3d &R1,
        const Eigen::Matrix3d &R2
    ) {
        // This is a 3-point method
        int nbr_pts = 3;

        // We expect inhomogenous input data, i.e. p1 and p2 are 2x3 matrices
        assert(p1.rows() == 2);
        assert(p2.rows() == 2);
        assert(p1.cols() == nbr_pts);
        assert(p2.cols() == nbr_pts);

        // Compute normalization matrix
        double scale1 = normalize2dpts(p1);
        double scale2 = normalize2dpts(p2);
        double scale = std::max(scale1, scale2);
        Eigen::Vector3d s;
        s << scale, scale, 1.0;
        Eigen::DiagonalMatrix<double, 3> S = s.asDiagonal();

        // Normalize data
        Eigen::Matrix3d x1;
        Eigen::Matrix3d x2;
        x1 = p1.colwise().homogeneous();
        x2 = p2.colwise().homogeneous();
        x1 = S * x1;
        x2 = S * x2;

        // Compute relative rotation
        Eigen::Matrix3d R = R2 * R1.transpose();

        Eigen::Matrix<double, 27, 1> x;
        x << x1.col(0), x1.col(1), x1.col(2),
             x2.col(0), x2.col(1), x2.col(2),
             R.col(0), R.col(1), R.col(2);

        Eigen::Matrix<double, 5, 1> coeffs = calculate_coefficients(x);

        Eigen::Vector4cd w  = solve_quartic(
            coeffs(1) / coeffs(0),
            coeffs(2) / coeffs(0),
            coeffs(3) / coeffs(0),
            coeffs(4) / coeffs(0));

        // Construct putative output
        double thresh = 1e-12;
        Eigen::Matrix3d M;
        std::vector<RelPose> output;
        RelPose relpose;
        Eigen::Matrix3d Q;
        Eigen::Vector3d kinv;
        Eigen::DiagonalMatrix<double, 3> Kinv;
        Eigen::Matrix3d skew_t;

        // Householder is just 500 ns slower than analytic, but is significantly more stable
        for (int i=0; i < w.size(); i++) {
            if (std::abs(std::imag(w[i])) < thresh) {
                M = create_M(std::real(w[i]), x);
                auto qr = M.transpose().colPivHouseholderQr();
                Q = qr.householderQ();
                relpose.t = Q.col(2);
                relpose.f = std::real(w[i]) / scale;

                // Compute fundamental matrix
                kinv << 1.0 / relpose.f, 1.0 / relpose.f, 1.0;
                Kinv = kinv.asDiagonal();
                skew_t << 0, -relpose.t(2), relpose.t(1),
                          relpose.t(2), 0, -relpose.t(0),
                         -relpose.t(1), relpose.t(0), 0;
                relpose.F = Kinv * skew_t * R * Kinv;

                output.push_back(relpose);
            }
        }

        return output;
    }